

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O3

int TVMArrayCopyFromBytes(TVMArrayHandle handle,void *data,size_t nbytes)

{
  TVMContext ctx;
  long lVar1;
  ostream *poVar2;
  DeviceAPI *pDVar3;
  long lVar4;
  LogCheckError _check_err;
  size_t nbytes_local;
  size_t arr_size;
  LogMessageFatal local_1a0;
  
  if ((long)handle->ndim < 1) {
    lVar1 = 1;
  }
  else {
    lVar1 = 1;
    lVar4 = 0;
    do {
      lVar1 = lVar1 * handle->shape[lVar4];
      lVar4 = lVar4 + 1;
    } while (handle->ndim != lVar4);
  }
  arr_size = (ulong)((uint)(handle->dtype).lanes * (uint)(handle->dtype).bits + 7 >> 3) * lVar1;
  nbytes_local = nbytes;
  dmlc::LogCheck_EQ<unsigned_long,unsigned_long>((dmlc *)&_check_err,&arr_size,&nbytes_local);
  if (_check_err.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/ndarray.cc"
               ,0x101);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"arr_size == nbytes",0x12);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,((_check_err.str)->_M_dataplus)._M_p,
                        (_check_err.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"TVMArrayCopyFromBytes: size mismatch",0x24);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  dmlc::LogCheckError::~LogCheckError(&_check_err);
  ctx.device_type = (handle->ctx).device_type;
  ctx.device_id = (handle->ctx).device_id;
  pDVar3 = tvm::runtime::DeviceAPI::Get(ctx,false);
  (*pDVar3->_vptr_DeviceAPI[6])
            (pDVar3,data,0,handle->data,handle->byte_offset,nbytes_local,1,handle->ctx,
             (ulong)(uint)handle->dtype,0);
  return 0;
}

Assistant:

int TVMArrayCopyFromBytes(TVMArrayHandle handle,
                          void *data,
                          size_t nbytes) {
  API_BEGIN();
  TVMContext cpu_ctx;
  cpu_ctx.device_type = kDLCPU;
  cpu_ctx.device_id = 0;
  size_t arr_size = GetDataSize(*handle);
  CHECK_EQ(arr_size, nbytes)
      << "TVMArrayCopyFromBytes: size mismatch";
  DeviceAPI::Get(handle->ctx)->CopyDataFromTo(data, 0, handle->data, static_cast<size_t>(handle->byte_offset), nbytes, cpu_ctx, handle->ctx, handle->dtype, nullptr);
  API_END();
}